

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O1

void Cec3_ManPrintStats(Gia_Man_t *p,Cec3_Par_t *pPars,Cec3_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  
  if (pPars->fVerbose != 0) {
    if (pMan == (Cec3_Man_t *)0x0) {
      uVar2 = 0;
      printf("S =%5d ",0);
    }
    else {
      printf("S =%5d ",(ulong)(uint)pMan->nSatSat);
      uVar2 = pMan->nSatUnsat;
    }
    uVar1 = 0;
    printf("U =%5d ",(ulong)uVar2);
    if (pMan != (Cec3_Man_t *)0x0) {
      uVar1 = pMan->nSatUndec;
    }
    printf("F =%5d ",(ulong)uVar1);
    Gia_ManEquivPrintClasses(p,pPars->fVeryVerbose,0.0);
    return;
  }
  return;
}

Assistant:

void Cec3_ManPrintStats( Gia_Man_t * p, Cec3_Par_t * pPars, Cec3_Man_t * pMan )
{
    if ( !pPars->fVerbose )
        return;
    printf( "S =%5d ", pMan ? pMan->nSatSat   : 0 );
    printf( "U =%5d ", pMan ? pMan->nSatUnsat : 0 );
    printf( "F =%5d ", pMan ? pMan->nSatUndec : 0 );
    Gia_ManEquivPrintClasses( p, pPars->fVeryVerbose, 0 );
}